

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_triple_parse_mutex_required(void)

{
  int iVar1;
  char *pcVar2;
  char *__ptr;
  cargo_t cargo;
  char *s;
  float c;
  int b;
  int a;
  char *args [1];
  char *args3 [3];
  char *args2 [3];
  cargo_t local_80;
  char *local_78;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  char *local_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  
  iVar1 = cargo_init(&local_80,0,"program");
  if (iVar1 != 0) {
    return "Failed to init cargo";
  }
  local_60 = "program";
  local_28 = "8.0";
  local_38 = "program";
  pcStack_30 = "-c";
  local_48 = "def";
  local_58 = "program";
  pcStack_50 = "--delta";
  local_64 = 0;
  local_68 = 0;
  local_6c = 0x40e00000;
  local_78 = strdup("abc");
  if (local_78 == (char *)0x0) {
    pcVar2 = "Failed to allocate";
    goto LAB_001212f7;
  }
  cargo_add_mutex_group(local_80,CARGO_MUTEXGRP_ONE_REQUIRED,"mg",(char *)0x0,(char *)0x0);
  cargo_add_option(local_80,0,"<!mg> --alpha -a","an option","i",&local_64);
  cargo_add_option(local_80,0,"<!mg> --beta -b","another option","i",&local_68);
  cargo_add_option(local_80,0,"--centauri -c","another option","f",&local_6c);
  cargo_add_option(local_80,0,"--delta -d","another option","s",&local_78);
  iVar1 = cargo_parse(local_80,CARGO_SKIP_CHECK_MUTEX,1,1,&local_60);
  __ptr = local_78;
  if (iVar1 == 0) {
    if (local_78 == (char *)0x0) {
LAB_001212f0:
      pcVar2 = "Expected s to be \'abc\'";
      goto LAB_001212f7;
    }
    iVar1 = strcmp(local_78,"abc");
    if (iVar1 == 0) {
      iVar1 = cargo_parse(local_80,CARGO_SKIP_CHECK_MUTEX,1,3,&local_38);
      __ptr = local_78;
      if (iVar1 == 0) {
        if (local_78 == (char *)0x0) goto LAB_001212f0;
        iVar1 = strcmp(local_78,"abc");
        if (iVar1 != 0) goto LAB_0012124f;
        pcVar2 = (char *)0x0;
        iVar1 = cargo_parse(local_80,0,1,3,&local_58);
        if (-1 < iVar1) {
          pcVar2 = "Parse did not fail 3";
        }
      }
      else {
        pcVar2 = "Parse failed 2";
      }
      goto LAB_00121213;
    }
LAB_0012124f:
    pcVar2 = "Expected s to be \'abc\'";
  }
  else {
    pcVar2 = "Parse failed 1";
LAB_00121213:
    __ptr = local_78;
    if (local_78 == (char *)0x0) goto LAB_001212f7;
  }
  if (replaced_cargo_free == (cargo_free_f)0x0) {
    free(__ptr);
  }
  else {
    (*replaced_cargo_free)(__ptr);
  }
LAB_001212f7:
  cargo_destroy(&local_80);
  return pcVar2;
}

Assistant:

_TEST_START(TEST_triple_parse_mutex_required)
{
    char *args[] = { "program" };
    char *args2[] = { "program", "-c", "8.0" };
    char *args3[] = { "program", "--delta", "def" };
    int a = 0;
    int b = 0;
    float c = 7.0f;
    char *s = strdup("abc");
    cargo_assert(s, "Failed to allocate");

    ret |= cargo_add_mutex_group(cargo, CARGO_MUTEXGRP_ONE_REQUIRED, "mg", NULL, NULL);

    ret |= cargo_add_option(cargo, 0, "<!mg> --alpha -a", "an option", "i", &a);
    ret |= cargo_add_option(cargo, 0, "<!mg> --beta -b", "another option", "i", &b);
    ret |= cargo_add_option(cargo, 0, "--centauri -c", "another option", "f", &c);
    ret |= cargo_add_option(cargo, 0, "--delta -d", "another option", "s", &s);

    ret = cargo_parse(cargo, CARGO_SKIP_CHECK_MUTEX, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed 1");
    cargo_assert(s && !strcmp(s, "abc"), "Expected s to be 'abc'");

    ret = cargo_parse(cargo, CARGO_SKIP_CHECK_MUTEX, 1, sizeof(args2) / sizeof(args2[0]), args2);
    cargo_assert(ret == 0, "Parse failed 2");
    cargo_assert(s && !strcmp(s, "abc"), "Expected s to be 'abc'");

    ret = cargo_parse(cargo, 0, 1, sizeof(args3) / sizeof(args3[0]), args3);
    cargo_assert(ret < 0, "Parse did not fail 3");

    _TEST_CLEANUP();
    _cargo_xfree(&s);
}